

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

void __thiscall tcu::Matrix<tcu::Interval,_2,_4>::Matrix(Matrix<tcu::Interval,_2,_4> *this)

{
  int i;
  long lVar1;
  long lVar2;
  Vector<tcu::Interval,_2> *pVVar3;
  double *pdVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  undefined1 auStack_40 [8];
  double adStack_38 [5];
  double local_10;
  double dStack_8;
  
  lVar1 = 0;
  pVVar3 = (Vector<tcu::Interval,_2> *)this;
  do {
    lVar5 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar3->m_data)->m_data[0].m_data +
       lVar5 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar3->m_data)->m_data[0].m_data +
       lVar5 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar3->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar5) = 0xfff0000000000000;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x40);
    lVar5 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar3->m_data)->m_data[0].m_data +
       lVar5 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar3->m_data)->m_data[0].m_data +
       lVar5 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar3->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar5) = 0xfff0000000000000;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 == 0x28);
    lVar1 = lVar1 + 0x30;
    pVVar3 = pVVar3 + 1;
  } while (lVar1 != 0xc0);
  lVar1 = 0;
  do {
    lVar5 = 0x10;
    do {
      auStack_40[lVar5] = 0;
      *(undefined8 *)((long)adStack_38 + lVar5) = 0x7ff0000000000000;
      *(undefined8 *)((long)adStack_38 + lVar5 + 8) = 0xfff0000000000000;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x40);
    lVar5 = 0x10;
    do {
      auStack_40[lVar5] = 0;
      *(undefined8 *)((long)adStack_38 + lVar5) = 0x7ff0000000000000;
      *(undefined8 *)((long)adStack_38 + lVar5 + 8) = 0xfff0000000000000;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 == 0x28);
    pdVar4 = &(this->m_data).m_data[lVar1].m_data[1].m_lo;
    *pdVar4 = local_10;
    pdVar4[1] = dStack_8;
    pdVar4 = &(this->m_data).m_data[lVar1].m_data[0].m_hi;
    *pdVar4 = adStack_38[3];
    pdVar4[1] = adStack_38[4];
    pVVar3 = (this->m_data).m_data + lVar1;
    *(double *)pVVar3->m_data = adStack_38[1];
    pVVar3->m_data[0].m_lo = adStack_38[2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  pdVar4 = &(this->m_data).m_data[0].m_data[0].m_hi;
  lVar5 = 0;
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      uVar7 = 0x3ff00000;
      if (lVar5 != lVar2) {
        uVar7 = 0;
      }
      *(undefined1 *)((long)pdVar4 + lVar2 + -0x10) = 0;
      *(ulong *)((long)pdVar4 + lVar2 + -8) = (ulong)uVar7 << 0x20;
      *(ulong *)((long)pdVar4 + lVar2) = (ulong)uVar7 << 0x20;
      lVar2 = lVar2 + 0x30;
    } while (lVar2 != 0xc0);
    lVar5 = lVar5 + 0x30;
    pdVar4 = pdVar4 + 3;
    bVar6 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar6);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}